

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BailOut.cpp
# Opt level: O3

void __thiscall BailOutInfo::PartialDeepCopyTo(BailOutInfo *this,BailOutInfo *other)

{
  StartCallInfo *pSVar1;
  GeneratorBailInInstr *pGVar2;
  Opnd *pOVar3;
  uint uVar4;
  BVSparse<Memory::JitArenaAllocator> *pBVar5;
  
  other->wasCloned = this->wasCloned;
  other->isInvertedBranch = this->isInvertedBranch;
  other->sharedBailOutKind = this->sharedBailOutKind;
  other->isLoopTopBailOutInfo = this->isLoopTopBailOutInfo;
  other->bailOutOffset = this->bailOutOffset;
  uVar4 = this->startCallCount;
  other->polymorphicCacheIndex = this->polymorphicCacheIndex;
  other->startCallCount = uVar4;
  other->totalOutParamCount = this->totalOutParamCount;
  other->stackLiteralBailOutInfoCount = this->stackLiteralBailOutInfoCount;
  other->wasCopied = this->wasCopied;
  other->bailOutRecord = this->bailOutRecord;
  CapturedValues::CopyTo(this->capturedValues,this->bailOutFunc->m_alloc,other->capturedValues);
  CapturedValues::CopyTo
            (this->usedCapturedValues,this->bailOutFunc->m_alloc,other->usedCapturedValues);
  if (this->byteCodeUpwardExposedUsed != (BVSparse<Memory::JitArenaAllocator> *)0x0) {
    pBVar5 = BVSparse<Memory::JitArenaAllocator>::CopyNew
                       (this->byteCodeUpwardExposedUsed,this->bailOutFunc->m_alloc);
    other->byteCodeUpwardExposedUsed = pBVar5;
  }
  if (this->liveVarSyms != (BVSparse<Memory::JitArenaAllocator> *)0x0) {
    pBVar5 = BVSparse<Memory::JitArenaAllocator>::CopyNew
                       (this->liveVarSyms,this->bailOutFunc->m_alloc);
    other->liveVarSyms = pBVar5;
  }
  if (this->liveLosslessInt32Syms != (BVSparse<Memory::JitArenaAllocator> *)0x0) {
    pBVar5 = BVSparse<Memory::JitArenaAllocator>::CopyNew
                       (this->liveLosslessInt32Syms,this->bailOutFunc->m_alloc);
    other->liveLosslessInt32Syms = pBVar5;
  }
  if (this->liveFloat64Syms != (BVSparse<Memory::JitArenaAllocator> *)0x0) {
    pBVar5 = BVSparse<Memory::JitArenaAllocator>::CopyNew
                       (this->liveFloat64Syms,this->bailOutFunc->m_alloc);
    other->liveFloat64Syms = pBVar5;
  }
  if (this->outParamInlinedArgSlot != (BVSparse<Memory::JitArenaAllocator> *)0x0) {
    pBVar5 = BVSparse<Memory::JitArenaAllocator>::CopyNew
                       (this->outParamInlinedArgSlot,this->bailOutFunc->m_alloc);
    other->outParamInlinedArgSlot = pBVar5;
  }
  other->argOutSyms = this->argOutSyms;
  pSVar1 = this->startCallInfo;
  other->startCallFunc = this->startCallFunc;
  other->startCallInfo = pSVar1;
  other->stackLiteralBailOutInfo = this->stackLiteralBailOutInfo;
  other->outParamOffsets = this->outParamOffsets;
  pGVar2 = this->bailInInstr;
  other->bailOutInstr = this->bailOutInstr;
  other->bailInInstr = pGVar2;
  other->bailOutOpcode = this->bailOutOpcode;
  pOVar3 = this->branchConditionOpnd;
  other->bailOutFunc = this->bailOutFunc;
  other->branchConditionOpnd = pOVar3;
  return;
}

Assistant:

void BailOutInfo::PartialDeepCopyTo(BailOutInfo * const other) const
{
    // Primitive types
    other->wasCloned = this->wasCloned;
    other->isInvertedBranch = this->isInvertedBranch;
    other->sharedBailOutKind = this->sharedBailOutKind;
    other->isLoopTopBailOutInfo = this->isLoopTopBailOutInfo;
    other->bailOutOffset = this->bailOutOffset;
    other->polymorphicCacheIndex = this->polymorphicCacheIndex;
    other->startCallCount = this->startCallCount;
    other->totalOutParamCount = this->totalOutParamCount;
    other->stackLiteralBailOutInfoCount = this->stackLiteralBailOutInfoCount;
#if DBG
    other->wasCopied = this->wasCopied;
#endif

    other->bailOutRecord = this->bailOutRecord;

    this->capturedValues->CopyTo(this->bailOutFunc->m_alloc, other->capturedValues);
    this->usedCapturedValues->CopyTo(this->bailOutFunc->m_alloc, other->usedCapturedValues);

    if (this->byteCodeUpwardExposedUsed != nullptr)
    {
        other->byteCodeUpwardExposedUsed = this->byteCodeUpwardExposedUsed->CopyNew(this->bailOutFunc->m_alloc);
    }

    if (this->liveVarSyms != nullptr)
    {
        other->liveVarSyms = this->liveVarSyms->CopyNew(this->bailOutFunc->m_alloc);
    }

    if (this->liveLosslessInt32Syms != nullptr)
    {
        other->liveLosslessInt32Syms = this->liveLosslessInt32Syms->CopyNew(this->bailOutFunc->m_alloc);
    }

    if (this->liveFloat64Syms != nullptr)
    {
        other->liveFloat64Syms = this->liveFloat64Syms->CopyNew(this->bailOutFunc->m_alloc);
    }

    if (this->outParamInlinedArgSlot != nullptr)
    {
        other->outParamInlinedArgSlot = this->outParamInlinedArgSlot->CopyNew(this->bailOutFunc->m_alloc);
    }

    other->startCallFunc = this->startCallFunc;
    other->argOutSyms = this->argOutSyms;
    other->startCallInfo = this->startCallInfo;
    other->stackLiteralBailOutInfo = this->stackLiteralBailOutInfo;
    other->outParamOffsets = this->outParamOffsets;


#ifdef _M_IX86
    other->outParamFrameAdjustArgSlot = this->outParamFrameAdjustArgSlot;
    other->inlinedStartCall = this->inlinedStartCall;
#endif

    other->bailOutInstr = this->bailOutInstr;
    other->bailInInstr = this->bailInInstr;

#if ENABLE_DEBUG_CONFIG_OPTIONS
    other->bailOutOpcode = this->bailOutOpcode;
#endif

    other->bailOutFunc = this->bailOutFunc;
    other->branchConditionOpnd = this->branchConditionOpnd;
}